

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,4ul,phmap::NullMutex>,void>
               (parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>
                *container,ostream *os)

{
  bool bVar1;
  anon_union_8_1_a8a14541_for_iterator_1 aVar2;
  long lVar3;
  const_iterator __begin0;
  char local_61;
  iterator local_60;
  
  local_60.inner_._0_1_ = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_60,1);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::begin((const_iterator *)&local_60,
          &container->
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
         );
  if (CONCAT71(local_60.inner_._1_7_,local_60.inner_._0_1_) != 0) {
    lVar3 = 0;
    do {
      aVar2 = local_60.it_.field_1;
      if (lVar3 == 0) {
LAB_0016844a:
        local_61 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_61,1);
        std::ostream::operator<<((ostream *)os,*aVar2.slot_);
        lVar3 = lVar3 + 1;
        bVar1 = true;
      }
      else {
        local_61 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_61,1);
        if (lVar3 != 0x20) goto LAB_0016844a;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar3 = 0x20;
        bVar1 = false;
      }
      if (!bVar1) break;
      phmap::priv::
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
      ::iterator::operator++(&local_60);
    } while (CONCAT71(local_60.inner_._1_7_,local_60.inner_._0_1_) != 0);
    if (lVar3 != 0) {
      local_60.inner_._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_60,1);
    }
  }
  local_60.inner_._0_1_ = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_60,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }